

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O0

unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true> __thiscall
duckdb::MultiFileColumnMapper::CreateFilters
          (MultiFileColumnMapper *this,
          map<unsigned_long,_std::reference_wrapper<duckdb::TableFilter>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>_>
          *filters,ResultColumnMapping *mapping)

{
  bool bVar1;
  undefined8 uVar2;
  pointer ppVar3;
  reference this_00;
  Expression *args;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
  args_1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_> in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_bool>
  pVar4;
  LogicalType *in_stack_00000098;
  MultiFileIndexMapping *in_stack_000000a0;
  TableFilter *in_stack_000000a8;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> local_filter;
  LogicalType *global_type;
  LogicalType *local_type;
  idx_t filter_idx;
  idx_t local_id;
  MultiFileColumnMap *map_entry;
  iterator local_it;
  TableFilter *global_filter;
  unsigned_long *global_index;
  pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_> *it;
  iterator __end1;
  iterator __begin1;
  map<unsigned_long,_std::reference_wrapper<duckdb::TableFilter>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>_>
  *__range1;
  unordered_map<unsigned_long,_duckdb::MultiFileColumnMap,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>_>_>
  *global_to_local;
  BaseFileReader *reader;
  templated_unique_single_t *result;
  string *in_stack_fffffffffffffe28;
  unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
  *in_stack_fffffffffffffe30;
  mapped_type *in_stack_fffffffffffffe38;
  map<unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
  *in_stack_fffffffffffffe40;
  Expression *expr;
  undefined1 local_108 [8];
  _Base_ptr local_100;
  undefined1 local_f8;
  undefined1 local_e8 [16];
  LogicalType *local_d8;
  LogicalType *local_d0;
  idx_t local_c8;
  idx_t local_c0;
  MultiFileColumnMap *local_b8;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [32];
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_false>
  local_88 [3];
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_false> local_70;
  TableFilter *local_68;
  reference local_60;
  reference local_58;
  _Self local_50;
  _Self local_48;
  undefined8 local_40;
  undefined1 local_31;
  undefined8 local_30;
  type local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  bVar1 = ::std::
          map<unsigned_long,_std::reference_wrapper<duckdb::TableFilter>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>_>
          ::empty((map<unsigned_long,_std::reference_wrapper<duckdb::TableFilter>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>_>
                   *)0x15632a7);
  if (bVar1) {
    unique_ptr<duckdb::TableFilterSet,std::default_delete<duckdb::TableFilterSet>,true>::
    unique_ptr<std::default_delete<duckdb::TableFilterSet>,void>
              ((unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  }
  else {
    local_28 = shared_ptr<duckdb::BaseFileReader,_true>::operator*
                         ((shared_ptr<duckdb::BaseFileReader,_true> *)in_stack_fffffffffffffe30);
    local_30 = local_20;
    local_31 = 0;
    make_uniq<duckdb::TableFilterSet>();
    local_40 = local_18;
    local_48._M_node =
         (_Base_ptr)
         ::std::
         map<unsigned_long,_std::reference_wrapper<duckdb::TableFilter>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>_>
         ::begin((map<unsigned_long,_std::reference_wrapper<duckdb::TableFilter>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>_>
                  *)in_stack_fffffffffffffe28);
    local_50._M_node =
         (_Base_ptr)
         ::std::
         map<unsigned_long,_std::reference_wrapper<duckdb::TableFilter>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>_>
         ::end((map<unsigned_long,_std::reference_wrapper<duckdb::TableFilter>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>_>
                *)in_stack_fffffffffffffe28);
    while (bVar1 = ::std::operator!=(&local_48,&local_50), bVar1) {
      local_60 = ::std::
                 _Rb_tree_iterator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>
                 ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>
                              *)0x1563366);
      local_58 = local_60;
      local_68 = ::std::reference_wrapper<duckdb::TableFilter>::get(&local_60->second);
      local_70._M_cur =
           (__node_type *)
           ::std::
           unordered_map<unsigned_long,_duckdb::MultiFileColumnMap,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>_>_>
           ::find((unordered_map<unsigned_long,_duckdb::MultiFileColumnMap,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>_>_>
                   *)in_stack_fffffffffffffe28,(key_type *)0x15633ac);
      local_88[0]._M_cur =
           (__node_type *)
           ::std::
           unordered_map<unsigned_long,_duckdb::MultiFileColumnMap,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>_>_>
           ::end((unordered_map<unsigned_long,_duckdb::MultiFileColumnMap,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>_>_>
                  *)in_stack_fffffffffffffe28);
      bVar1 = ::std::__detail::operator==(&local_70,local_88);
      if (bVar1) {
        local_aa = 1;
        uVar2 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_a8,
                   "Error in \'EvaluateConstantFilters\', this filter should not end up in CreateFilters!"
                   ,&local_a9);
        InternalException::InternalException
                  ((InternalException *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        local_aa = 0;
        __cxa_throw(uVar2,&InternalException::typeinfo,InternalException::~InternalException);
      }
      ppVar3 = ::std::__detail::
               _Node_iterator<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_false,_false>
                             *)0x156350d);
      local_b8 = &ppVar3->second;
      local_c0 = (local_b8->mapping).index;
      this_00 = vector<duckdb::ColumnIndex,_true>::operator[]
                          ((vector<duckdb::ColumnIndex,_true> *)in_stack_fffffffffffffe30,
                           (size_type)in_stack_fffffffffffffe28);
      local_c8 = ColumnIndex::GetPrimaryIndex(this_00);
      local_d0 = local_b8->local_type;
      local_d8 = local_b8->global_type;
      unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::unique_ptr
                ((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
                 0x156359f);
      if (local_b8->filter_conversion == COPY_DIRECTLY) {
        (*local_68->_vptr_TableFilter[4])(local_e8);
        unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::operator=
                  ((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    *)in_stack_fffffffffffffe30,
                   (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    *)in_stack_fffffffffffffe28);
        unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    *)0x15635ff);
      }
      else if (local_b8->filter_conversion == CAST_FILTER) {
        TryCastTableFilter(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
        unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::operator=
                  ((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    *)in_stack_fffffffffffffe30,
                   (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    *)in_stack_fffffffffffffe28);
        unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    *)0x1563663);
      }
      bVar1 = ::std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>
                          *)0x1563674);
      if (bVar1) {
        unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>::
        operator->((unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                    *)in_stack_fffffffffffffe30);
        pVar4 = ::std::
                map<unsigned_long,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>>
                ::
                emplace<unsigned_long&,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                          (in_stack_fffffffffffffe40,(unsigned_long *)in_stack_fffffffffffffe38,
                           (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                            *)in_stack_fffffffffffffe30);
        local_100 = (_Base_ptr)pVar4.first._M_node;
        local_f8 = pVar4.second;
      }
      else {
        args = (Expression *)
               unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
               ::operator->((unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                             *)in_stack_fffffffffffffe30);
        expr = args;
        (*local_68->_vptr_TableFilter[4])(local_108);
        pVar4 = ::std::
                map<unsigned_long,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>>
                ::
                emplace<unsigned_long&,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                          (in_stack_fffffffffffffe40,(unsigned_long *)in_stack_fffffffffffffe38,
                           (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                            *)in_stack_fffffffffffffe30);
        args_1 = pVar4.first._M_node;
        unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    *)0x1563753);
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      *)in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffe30);
        SetIndexToZero(expr);
        in_stack_fffffffffffffe40 =
             (map<unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
              *)vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                              *)in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
        in_stack_fffffffffffffe38 =
             ::std::
             unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
             ::operator[](in_stack_fffffffffffffe30,(key_type *)in_stack_fffffffffffffe28);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffe30,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffe28);
        make_uniq<duckdb::BoundReferenceExpression,duckdb::LogicalType_const&,unsigned_long&>
                  ((LogicalType *)args,(unsigned_long *)args_1._M_node);
        unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
        unique_ptr<duckdb::BoundReferenceExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffe30,
                   (unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>_>
                    *)in_stack_fffffffffffffe28);
        in_stack_fffffffffffffe30 =
             (unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
              *)vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                              *)in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffe30,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffe28);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   0x1563861);
        unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
        ::~unique_ptr((unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
                       *)0x156386e);
      }
      unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::~unique_ptr
                ((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
                 0x15638d0);
      ::std::
      _Rb_tree_iterator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>
                    *)in_stack_fffffffffffffe30);
    }
  }
  return (unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>)
         (__uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
         .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<TableFilterSet> MultiFileColumnMapper::CreateFilters(map<idx_t, reference<TableFilter>> &filters,
                                                                ResultColumnMapping &mapping) {
	if (filters.empty()) {
		return nullptr;
	}
	auto &reader = *reader_data.reader;
	auto &global_to_local = mapping.global_to_local;
	auto result = make_uniq<TableFilterSet>();
	for (auto &it : filters) {
		auto &global_index = it.first;
		auto &global_filter = it.second.get();

		auto local_it = global_to_local.find(global_index);
		if (local_it == global_to_local.end()) {
			throw InternalException(
			    "Error in 'EvaluateConstantFilters', this filter should not end up in CreateFilters!");
		}
		auto &map_entry = local_it->second;
		auto local_id = map_entry.mapping.index;
		auto filter_idx = reader.column_indexes[local_id].GetPrimaryIndex();
		auto &local_type = map_entry.local_type;
		auto &global_type = map_entry.global_type;

		unique_ptr<TableFilter> local_filter;
		switch (map_entry.filter_conversion) {
		case FilterConversionType::COPY_DIRECTLY:
			// no conversion required - just copy the filter
			local_filter = global_filter.Copy();
			break;
		case FilterConversionType::CAST_FILTER:
			// types are different - try to convert
			local_filter = TryCastTableFilter(global_filter, map_entry.mapping, local_type);
			break;
		default:
			// we need to execute the filter globally
			break;
		}
		if (local_filter) {
			// succeeded in casting - push the local filter
			result->filters.emplace(local_id, std::move(local_filter));
		} else {
			// failed to cast - copy the global filter and evaluate the conversion expression in the reader
			result->filters.emplace(local_id, global_filter.Copy());

			// add the expression to the expression map - we are now evaluating this inside the reader directly
			// we need to set the index of the references inside the expression to 0
			SetIndexToZero(*reader_data.expressions[local_id]);
			reader.expression_map[filter_idx] = std::move(reader_data.expressions[local_id]);

			// reset the expression - since we are evaluating it in the reader we can just reference it
			reader_data.expressions[local_id] = make_uniq<BoundReferenceExpression>(global_type, local_id);
		}
	}
	return result;
}